

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::ConvertCase
                   (string *__return_storage_ptr__,string *input,Case output_case,Case input_case)

{
  string *input_00;
  function<char_(char)> local_b0;
  function<char_(char)> local_90;
  string local_70;
  string local_40;
  Case local_20;
  Case local_1c;
  Case input_case_local;
  Case output_case_local;
  string *input_local;
  
  local_20 = input_case;
  local_1c = output_case;
  _input_case_local = input;
  input_local = __return_storage_ptr__;
  if (output_case == kKeep) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
    return __return_storage_ptr__;
  }
  switch(input_case) {
  case kUpperCamel:
  case kLowerCamel:
    anon_unknown_1::CamelToSnake(&local_40,input);
    ConvertCase(__return_storage_ptr__,&local_40,local_1c,kSnake);
    std::__cxx11::string::~string((string *)&local_40);
    return __return_storage_ptr__;
  default:
    break;
  case kDasher:
    anon_unknown_1::DasherToSnake(&local_70,input);
    ConvertCase(__return_storage_ptr__,&local_70,local_1c,kSnake);
    std::__cxx11::string::~string((string *)&local_70);
    return __return_storage_ptr__;
  case kKeep:
    printf("WARNING: Converting from kKeep case.\n");
  }
  input_00 = _input_case_local;
  switch(local_1c) {
  case kUpperCamel:
    anon_unknown_1::ToCamelCase(__return_storage_ptr__,_input_case_local,true);
    break;
  case kLowerCamel:
    anon_unknown_1::ToCamelCase(__return_storage_ptr__,_input_case_local,false);
    break;
  case kSnake:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)_input_case_local);
    break;
  case kScreamingSnake:
    anon_unknown_1::ToSnakeCase(__return_storage_ptr__,_input_case_local,true);
    break;
  case kAllUpper:
    std::function<char(char)>::function<char(&)(char),void>
              ((function<char(char)> *)&local_90,CharToUpper);
    anon_unknown_1::ToAll(__return_storage_ptr__,input_00,&local_90);
    std::function<char_(char)>::~function(&local_90);
    break;
  case kAllLower:
    std::function<char(char)>::function<char(&)(char),void>
              ((function<char(char)> *)&local_b0,CharToLower);
    anon_unknown_1::ToAll(__return_storage_ptr__,input_00,&local_b0);
    std::function<char_(char)>::~function(&local_b0);
    break;
  case kDasher:
    anon_unknown_1::ToDasher(__return_storage_ptr__,_input_case_local);
    break;
  default:
  case kUnknown:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)_input_case_local);
    break;
  case kSnake2:
    anon_unknown_1::SnakeToSnake2(__return_storage_ptr__,_input_case_local);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertCase(const std::string &input, Case output_case,
                        Case input_case) {
  if (output_case == Case::kKeep) return input;
  // The output cases expect snake_case inputs, so if we don't have that input
  // format, try to convert to snake_case.
  switch (input_case) {
    case Case::kLowerCamel:
    case Case::kUpperCamel:
      return ConvertCase(CamelToSnake(input), output_case);
    case Case::kDasher: return ConvertCase(DasherToSnake(input), output_case);
    case Case::kKeep: printf("WARNING: Converting from kKeep case.\n"); break;
    default:
    case Case::kSnake:
    case Case::kScreamingSnake:
    case Case::kAllLower:
    case Case::kAllUpper: break;
  }

  switch (output_case) {
    case Case::kUpperCamel: return ToCamelCase(input, true);
    case Case::kLowerCamel: return ToCamelCase(input, false);
    case Case::kSnake: return input;
    case Case::kScreamingSnake: return ToSnakeCase(input, true);
    case Case::kAllUpper: return ToAll(input, CharToUpper);
    case Case::kAllLower: return ToAll(input, CharToLower);
    case Case::kDasher: return ToDasher(input);
    case Case::kSnake2: return SnakeToSnake2(input);
    default:
    case Case::kUnknown: return input;
  }
}